

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiIO::AddMousePosEvent(ImGuiIO *this,float x,float y)

{
  ImGuiInputEvent local_18;
  
  local_18._16_8_ = 0;
  local_18.Type = ImGuiInputEventType_MousePos;
  local_18.Source = ImGuiInputSource_Mouse;
  local_18.field_2.MousePos.PosX = x;
  local_18.field_2.MousePos.PosY = y;
  ImVector<ImGuiInputEvent>::push_back(&GImGui->InputEventsQueue,&local_18);
  return;
}

Assistant:

void ImGuiIO::AddMousePosEvent(float x, float y)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(&g.IO == this && "Can only add events to current context.");

    ImGuiInputEvent e;
    e.Type = ImGuiInputEventType_MousePos;
    e.Source = ImGuiInputSource_Mouse;
    e.MousePos.PosX = x;
    e.MousePos.PosY = y;
    g.InputEventsQueue.push_back(e);
}